

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  BrotliHasherParams *pBVar1;
  MemoryManager *m;
  Hasher *hasher;
  size_t *num_commands;
  size_t *last_insert_len;
  size_t *num_literals;
  uint8_t prev_byte;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint8_t *data;
  uint16_t *puVar5;
  HasherCommon *pHVar6;
  void *pvVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  BrotliEncoderParams *pBVar10;
  undefined8 uVar11;
  ushort uVar12;
  int iVar13;
  uint8_t prev_byte2;
  uint16_t uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint32_t *puVar20;
  uint8_t *puVar21;
  int *piVar22;
  ulong uVar23;
  Command *pCVar24;
  char cVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  uint32_t uVar33;
  uint uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  size_t sVar44;
  ulong uVar45;
  ContextLut puVar46;
  bool bVar47;
  bool bVar48;
  size_t storage_ix_1;
  ulong local_220;
  ContextLut local_218;
  ulong local_210;
  Command *local_208;
  ulong local_200;
  ulong local_1f8;
  int *local_1f0;
  BlockSplitFromDecoder *local_1e8;
  BlockSplitFromDecoder *local_1e0;
  size_t *local_1d8;
  ulong local_1d0;
  uint8_t **local_1c8;
  size_t *local_1c0;
  uint32_t *local_1b8;
  size_t num_literal_contexts;
  ulong local_1a8;
  size_t storage_ix;
  BlockSplit local_170;
  BlockSplit local_140;
  uint32_t *local_110;
  size_t sStack_108;
  uint32_t *local_100;
  size_t sStack_f8;
  HistogramLiteral *local_f0;
  size_t sStack_e8;
  HistogramCommand *local_e0;
  size_t sStack_d8;
  HistogramDistance *local_d0;
  size_t sStack_c8;
  size_t table_size;
  uint32_t local_74;
  
  local_1e8 = (BlockSplitFromDecoder *)s->last_processed_pos_;
  puVar46 = (ContextLut)((ulong)local_1e8 & 0xffffffff);
  if (2 < (ulong)local_1e8 >> 0x1e) {
    puVar46 = (ContextLut)
              (ulong)(((int)((uint)local_1e8 * 2) >> 1 & 0xc0000000U) +
                      ((uint)local_1e8 & 0x3fffffff) + 0x80000000);
  }
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  local_1f8 = s->input_pos_;
  uVar40 = local_1f8 - (long)local_1e8;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < uVar40) {
    return 0;
  }
  uVar4 = (s->ringbuffer_).mask_;
  uVar19 = (ulong)uVar4;
  m = &s->memory_manager_;
  data = (s->ringbuffer_).buffer_;
  if (((s->params).quality == 1) && (s->command_buf_ == (uint32_t *)0x0)) {
    local_218 = puVar46;
    puVar20 = (uint32_t *)BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar20;
    puVar21 = (uint8_t *)BrotliAllocate(m,0x20000);
    s->literal_buf_ = puVar21;
    puVar46 = local_218;
  }
  local_1c8 = output;
  if ((uint)(s->params).quality < 2) {
    storage_ix = (size_t)s->last_bytes_bits_;
    if (is_last == 0 && (BlockSplitFromDecoder *)local_1f8 == local_1e8) {
      sVar44 = 0;
    }
    else {
      puVar21 = GetBrotliStorage(s,(ulong)((int)uVar40 * 2 + 0x1f7));
      *puVar21 = (uint8_t)s->last_bytes_;
      puVar21[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      uVar40 = uVar40 & 0xffffffff;
      piVar22 = GetHashTable(s,(s->params).quality,uVar40,&table_size);
      if ((s->params).quality == 0) {
        BrotliCompressFragmentFast
                  (m,data + ((uint)puVar46 & uVar4),uVar40,is_last,piVar22,table_size,s->cmd_depths_
                   ,s->cmd_bits_,&s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar21);
      }
      else {
        BrotliCompressFragmentTwoPass
                  (m,data + ((uint)puVar46 & uVar4),uVar40,is_last,s->command_buf_,s->literal_buf_,
                   piVar22,table_size,&storage_ix,puVar21);
      }
      sVar44 = storage_ix >> 3;
      s->last_bytes_ = (ushort)puVar21[sVar44];
      s->last_bytes_bits_ = (byte)storage_ix & 7;
      UpdateLastProcessedPos(s);
      *local_1c8 = puVar21;
    }
    *out_size = sVar44;
    return 1;
  }
  uVar23 = s->num_commands_ + (uVar40 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar23) {
    sVar44 = (uVar40 >> 2 & 0x3fffffff) + uVar23 + 0x10;
    s->cmd_alloc_size_ = sVar44;
    local_220 = uVar40;
    local_218 = puVar46;
    if (sVar44 == 0) {
      pCVar24 = (Command *)0x0;
    }
    else {
      pCVar24 = (Command *)BrotliAllocate(m,sVar44 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      memcpy(pCVar24,s->commands_,s->num_commands_ << 4);
      BrotliFree(m,s->commands_);
      s->commands_ = (Command *)0x0;
    }
    s->commands_ = pCVar24;
    uVar40 = local_220;
    puVar46 = local_218;
  }
  bVar47 = is_last != 0;
  hasher = &s->hasher_;
  uVar23 = uVar40 & 0xffffffff;
  bVar48 = (int)puVar46 == 0;
  uVar29 = (uint)(bVar48 && bVar47);
  if ((s->hasher_).common.extra == (void *)0x0) {
    pBVar1 = &(s->params).hasher;
    iVar17 = (s->params).quality;
    if (iVar17 < 10) {
      if ((iVar17 == 4) && (0xfffff < (s->params).size_hint)) {
        pBVar1->type = 0x36;
      }
      else if (iVar17 < 5) {
        pBVar1->type = iVar17;
      }
      else {
        iVar15 = (s->params).lgwin;
        if (iVar15 < 0x11) {
          iVar15 = 0x28;
          if (6 < iVar17) {
            iVar15 = (iVar17 == 9) + 0x29;
          }
          pBVar1->type = iVar15;
        }
        else {
          if ((iVar15 < 0x13) || ((s->params).size_hint < 0x100000)) {
            (s->params).hasher.type = 5;
            (s->params).hasher.block_bits = iVar17 + -1;
            iVar15 = 10;
            if (iVar17 == 9) {
              iVar15 = 0x10;
            }
            iVar16 = 4;
            if (6 < iVar17) {
              iVar16 = iVar15;
            }
            (s->params).hasher.bucket_bits = iVar17 < 7 ^ 0xf;
          }
          else {
            (s->params).hasher.type = 6;
            (s->params).hasher.bucket_bits = 0xf;
            (s->params).hasher.block_bits = iVar17 + -1;
            (s->params).hasher.hash_len = 5;
            iVar15 = 10;
            if (iVar17 == 9) {
              iVar15 = 0x10;
            }
            iVar16 = 4;
            if (6 < iVar17) {
              iVar16 = iVar15;
            }
          }
          (s->params).hasher.num_last_distances_to_check = iVar16;
        }
      }
    }
    else {
      pBVar1->type = 10;
    }
    iVar17 = (s->params).lgwin;
    if (0x18 < iVar17) {
      if (pBVar1->type == 3) {
        pBVar1->type = 0x23;
      }
      if (pBVar1->type == 0x36) {
        pBVar1->type = 0x37;
      }
      if (pBVar1->type == 6) {
        pBVar1->type = 0x41;
      }
    }
    iVar15 = pBVar1->type;
    sVar44 = 0;
    if (iVar15 < 0x23) {
      switch(iVar15) {
      case 2:
      case 3:
        sVar44 = 0x40000;
        break;
      case 4:
switchD_0012f65b_caseD_28:
        sVar44 = 0x80000;
        break;
      case 5:
      case 6:
        bVar26 = (byte)(s->params).hasher.bucket_bits;
        sVar44 = ((4L << (bVar26 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f)) +
                 (2L << (bVar26 & 0x3f));
        break;
      case 10:
        uVar36 = 1L << ((byte)iVar17 & 0x3f);
        uVar43 = uVar23;
        if (uVar36 < uVar23) {
          uVar43 = uVar36;
        }
        if (!bVar48 || !bVar47) {
          uVar43 = uVar36;
        }
        sVar44 = uVar43 * 8 + 0x80000;
      }
    }
    else {
      sVar44 = 0;
      if (iVar15 < 0x36) {
        switch(iVar15) {
        case 0x23:
          sVar44 = 0x4040000;
          break;
        case 0x28:
        case 0x29:
          goto switchD_0012f65b_caseD_28;
        case 0x2a:
          sVar44 = 0x140000;
        }
      }
      else if (iVar15 == 0x36) {
        sVar44 = 0x400000;
      }
      else if (iVar15 == 0x37) {
        sVar44 = 0x4400000;
      }
      else if (iVar15 == 0x41) {
        bVar26 = (byte)(s->params).hasher.bucket_bits;
        sVar44 = ((4L << (bVar26 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f)) +
                 (2L << (bVar26 & 0x3f)) + 0x4000000;
      }
    }
    if (sVar44 == 0) {
      puVar20 = (uint32_t *)0x0;
    }
    else {
      puVar20 = (uint32_t *)BrotliAllocate(m,sVar44);
    }
    (s->hasher_).common.extra = puVar20;
    iVar17 = pBVar1->bucket_bits;
    iVar15 = (s->params).hasher.block_bits;
    iVar16 = (s->params).hasher.hash_len;
    (s->hasher_).common.params.type = pBVar1->type;
    (s->hasher_).common.params.bucket_bits = iVar17;
    (s->hasher_).common.params.block_bits = iVar15;
    (s->hasher_).common.params.hash_len = iVar16;
    (s->hasher_).common.params.num_last_distances_to_check =
         (s->params).hasher.num_last_distances_to_check;
    iVar17 = (s->hasher_).common.params.type;
    if (iVar17 < 0x23) {
      switch(iVar17) {
      case 2:
      case 3:
      case 4:
switchD_0012f808_caseD_2:
        (s->hasher_).privat._H2.common = &hasher->common;
LAB_0012f8e8:
        (s->hasher_).privat._H2.buckets_ = puVar20;
        break;
      case 5:
        (s->hasher_).privat._H5.common_ = &hasher->common;
        iVar17 = (s->hasher_).common.params.bucket_bits;
        iVar15 = (s->hasher_).common.params.block_bits;
        sVar35 = 1L << ((byte)iVar17 & 0x3f);
        (s->hasher_).privat._H5.hash_shift_ = 0x20 - iVar17;
        (s->hasher_).privat._H5.bucket_size_ = sVar35;
        sVar44 = 1L << ((byte)iVar15 & 0x3f);
        (s->hasher_).privat._H5.block_size_ = sVar44;
        (s->hasher_).privat._H5.block_mask_ = (int)sVar44 - 1;
        (s->hasher_).privat._H5.num_ = (uint16_t *)puVar20;
        (s->hasher_).privat._H5.buckets_ = (uint32_t *)((long)puVar20 + sVar35 * 2);
        *(int *)&(s->hasher_).privat._H35.hb.table = iVar15;
        (s->hasher_).privat._H5.num_last_distances_to_check_ =
             (s->hasher_).common.params.num_last_distances_to_check;
        break;
      case 6:
        local_218 = puVar46;
        InitializeH6(&hasher->common,&(s->hasher_).privat._H6,
                     (BrotliEncoderParams *)&switchD_0012f808::switchdataD_0015bf38);
        puVar46 = local_218;
        break;
      case 10:
        (s->hasher_).privat._H2.buckets_ = puVar20;
        (s->hasher_).privat._H40.common = (HasherCommon *)(puVar20 + 0x20000);
        uVar27 = -1 << ((byte)(s->params).lgwin & 0x1f);
        *(ulong *)&(s->hasher_).privat = (ulong)~uVar27;
        (s->hasher_).privat._H5.hash_shift_ = uVar27 + 1;
      }
    }
    else if (iVar17 < 0x36) {
      switch(iVar17) {
      case 0x23:
switchD_0012f7bc_caseD_23:
        (s->hasher_).privat._H35.common = &hasher->common;
        (s->hasher_).privat._H35.extra = puVar20;
        puVar20 = (uint32_t *)(s->hasher_).common.dict_num_lookups;
        sVar44 = (s->hasher_).common.dict_num_matches;
        iVar17 = (s->hasher_).common.params.type;
        iVar15 = (s->hasher_).common.params.bucket_bits;
        iVar16 = (s->hasher_).common.params.block_bits;
        iVar13 = (s->hasher_).common.params.hash_len;
        uVar11 = *(undefined8 *)&(s->hasher_).common.params.num_last_distances_to_check;
        (s->hasher_).privat._H6.num_ = (uint16_t *)(hasher->common).extra;
        (s->hasher_).privat._H6.buckets_ = puVar20;
        (s->hasher_).privat._H35.hb_common.dict_num_matches = sVar44;
        *(int *)((long)&(s->hasher_).privat + 0x50) = iVar17;
        *(int *)((long)&(s->hasher_).privat + 0x54) = iVar15;
        *(int *)((long)&(s->hasher_).privat + 0x58) = iVar16;
        *(int *)((long)&(s->hasher_).privat + 0x5c) = iVar13;
        *(undefined8 *)&(s->hasher_).privat._H35.hb_common.params.num_last_distances_to_check =
             uVar11;
        (s->hasher_).privat._H35.fresh = 1;
        (s->hasher_).privat._H35.params = &s->params;
        break;
      case 0x28:
      case 0x29:
        (s->hasher_).privat._H40.common = &hasher->common;
        (s->hasher_).privat._H40.extra = puVar20;
        iVar17 = (s->params).quality;
        puVar20 = (uint32_t *)(ulong)((iVar17 < 7) + 7 << ((char)iVar17 - 4U & 0x1f));
        goto LAB_0012f8e8;
      case 0x2a:
        (s->hasher_).privat._H42.common = &hasher->common;
        (s->hasher_).privat._H42.extra = puVar20;
        iVar17 = (s->params).quality;
        *(ulong *)((long)&(s->hasher_).privat + 0x400) =
             (ulong)((iVar17 < 7) + 7 << ((char)iVar17 - 4U & 0x1f));
      }
    }
    else {
      if (iVar17 == 0x36) goto switchD_0012f808_caseD_2;
      if (iVar17 == 0x37) goto switchD_0012f7bc_caseD_23;
      if (iVar17 == 0x41) {
        (s->hasher_).privat._H65.common = &hasher->common;
        (s->hasher_).privat._H65.extra = puVar20;
        sVar44 = (s->hasher_).common.dict_num_lookups;
        pBVar10 = (BrotliEncoderParams *)(s->hasher_).common.dict_num_matches;
        iVar17 = (s->hasher_).common.params.type;
        iVar15 = (s->hasher_).common.params.bucket_bits;
        iVar16 = (s->hasher_).common.params.block_bits;
        iVar13 = (s->hasher_).common.params.hash_len;
        uVar11 = *(undefined8 *)&(s->hasher_).common.params.num_last_distances_to_check;
        (s->hasher_).privat._H35.common = (HasherCommon *)(hasher->common).extra;
        (s->hasher_).privat._H65.hb_common.dict_num_lookups = sVar44;
        (s->hasher_).privat._H35.params = pBVar10;
        *(int *)((long)&(s->hasher_).privat + 0x88) = iVar17;
        *(int *)((long)&(s->hasher_).privat + 0x8c) = iVar15;
        *(int *)((long)&(s->hasher_).privat + 0x90) = iVar16;
        *(int *)((long)&(s->hasher_).privat + 0x94) = iVar13;
        *(undefined8 *)&(s->hasher_).privat._H65.hb_common.params.num_last_distances_to_check =
             uVar11;
        (s->hasher_).privat._H65.fresh = 1;
        (s->hasher_).privat._H65.params = &s->params;
      }
    }
    (s->hasher_).common.is_prepared_ = 0;
  }
  uVar27 = (uint)puVar46;
  uVar43 = (ulong)puVar46 & 0xffffffff;
  uVar18 = (uint)uVar40;
  if ((s->hasher_).common.is_prepared_ == 0) {
    iVar17 = (s->hasher_).common.params.type;
    if (iVar17 < 0x23) {
      switch(iVar17) {
      case 2:
        puVar20 = (s->hasher_).privat._H2.buckets_;
        if ((uVar18 < 0x801) && (bVar48 && bVar47)) {
          if (uVar23 != 0) {
            uVar36 = 0;
            do {
              puVar20[(ulong)(*(long *)(data + uVar36) * -0x42e1ca5843000000) >> 0x30] = 0;
              uVar36 = uVar36 + 1;
            } while (uVar23 != uVar36);
          }
        }
        else {
          memset(puVar20,0,0x40000);
        }
        break;
      case 3:
        PrepareH3(&(s->hasher_).privat._H3,uVar29,uVar23,data);
        break;
      case 4:
        PrepareH4(&(s->hasher_).privat._H4,uVar29,uVar23,data);
        break;
      case 5:
        PrepareH5(&(s->hasher_).privat._H5,uVar29,uVar23,data);
        break;
      case 6:
        PrepareH6(&(s->hasher_).privat._H6,uVar29,uVar23,data);
        break;
      case 10:
        uVar33 = (s->hasher_).privat._H5.hash_shift_;
        puVar20 = (s->hasher_).privat._H2.buckets_;
        lVar30 = 0;
        do {
          puVar20[lVar30] = uVar33;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x20000);
      }
    }
    else if (iVar17 < 0x36) {
      switch(iVar17) {
      case 0x23:
        PrepareH35(&(s->hasher_).privat._H35,uVar29,uVar23,data);
        break;
      case 0x28:
        PrepareH40(&(s->hasher_).privat._H40,uVar29,uVar23,data);
        break;
      case 0x29:
        PrepareH41(&(s->hasher_).privat._H41,uVar29,uVar23,data);
        break;
      case 0x2a:
        PrepareH42(&(s->hasher_).privat._H42,uVar29,uVar23,data);
      }
    }
    else if (iVar17 == 0x36) {
      PrepareH54(&(s->hasher_).privat._H54,uVar29,uVar23,data);
    }
    else if (iVar17 == 0x37) {
      PrepareH55(&(s->hasher_).privat._H55,uVar29,uVar23,data);
    }
    else if (iVar17 == 0x41) {
      PrepareH65(&(s->hasher_).privat._H65,uVar29,uVar23,data);
    }
    if (uVar27 == 0) {
      (s->hasher_).common.dict_num_lookups = 0;
      (s->hasher_).common.dict_num_matches = 0;
    }
    (s->hasher_).common.is_prepared_ = 1;
  }
  iVar17 = (s->hasher_).common.params.type;
  if (0x22 < iVar17) {
    if (iVar17 < 0x36) {
      switch(iVar17) {
      case 0x23:
        if ((6 < uVar18) && (2 < uVar27)) {
          uVar29 = uVar27 - 3;
          puVar20 = (s->hasher_).privat._H2.buckets_;
          puVar20[(uint)(ushort)((ulong)(*(long *)(data + (uVar29 & uVar4)) * -0x42e1ca5843000000)
                                >> 0x30) + (uVar29 & 8) & 0xffff] = uVar29;
          uVar29 = uVar27 - 2;
          puVar20[(uint)(ushort)((ulong)(*(long *)(data + (uVar29 & uVar4)) * -0x42e1ca5843000000)
                                >> 0x30) + (uVar29 & 8) & 0xffff] = uVar29;
          uVar29 = uVar27 - 1;
          puVar20[(uint)(ushort)((ulong)(*(long *)(data + (uVar29 & uVar4)) * -0x42e1ca5843000000)
                                >> 0x30) + (uVar29 & 8) & 0xffff] = uVar29;
        }
        if (((ulong)puVar46 & 3) != 0) {
          uVar36 = 4 - ((ulong)puVar46 & 3);
          bVar47 = uVar23 < uVar36;
          uVar23 = uVar23 - uVar36;
          if (bVar47) {
            uVar23 = 0;
          }
          uVar43 = uVar43 + uVar36;
        }
        uVar37 = (ulong)((uint)uVar43 & uVar4);
        uVar36 = uVar19 - uVar37;
        if (uVar23 < uVar36) {
          uVar36 = uVar23;
        }
        if (0x1f < uVar36) {
          (s->hasher_).privat._H5.hash_shift_ = 0;
          iVar17 = 0;
          uVar23 = 0xfffffffffffffffc;
          do {
            iVar17 = iVar17 * (s->hasher_).privat._H35.hb.factor + (uint)data[uVar23 + uVar37 + 4] +
                     1;
            uVar23 = uVar23 + 4;
          } while (uVar23 < 0x1c);
LAB_00130b8f:
          (s->hasher_).privat._H5.hash_shift_ = iVar17;
        }
        goto LAB_00130b95;
      case 0x28:
      case 0x29:
        if ((2 < uVar18) && (2 < uVar27)) {
          uVar23 = uVar43 - 3;
          pvVar7 = (s->hasher_).privat._H40.extra;
          uVar29 = (uint)(*(int *)(data + ((uint)uVar23 & uVar4)) * 0x1e35a7bd) >> 0x11;
          uVar36 = (ulong)uVar29;
          uVar3 = (s->hasher_).privat._H42.free_slot_idx[0];
          (s->hasher_).privat._H42.free_slot_idx[0] = uVar3 + 1;
          uVar37 = uVar23 - *(uint *)((long)pvVar7 + uVar36 * 4);
          *(char *)((long)pvVar7 + (uVar23 & 0xffff) + 0x30000) = (char)uVar29;
          if (0xfffe < uVar37) {
            uVar37 = 0xffff;
          }
          *(short *)((long)pvVar7 + (ulong)uVar3 * 4 + 0x40000) = (short)uVar37;
          *(undefined2 *)((long)pvVar7 + (ulong)uVar3 * 4 + 0x40002) =
               *(undefined2 *)((long)pvVar7 + uVar36 * 2 + 0x20000);
          *(uint *)((long)pvVar7 + uVar36 * 4) = (uint)uVar23;
          *(ushort *)((long)pvVar7 + uVar36 * 2 + 0x20000) = uVar3;
          uVar23 = uVar43 - 2;
          pvVar7 = (s->hasher_).privat._H40.extra;
          uVar29 = (uint)(*(int *)(data + ((uint)uVar23 & uVar4)) * 0x1e35a7bd) >> 0x11;
          uVar36 = (ulong)uVar29;
          uVar3 = (s->hasher_).privat._H42.free_slot_idx[0];
          (s->hasher_).privat._H42.free_slot_idx[0] = uVar3 + 1;
          uVar37 = uVar23 - *(uint *)((long)pvVar7 + uVar36 * 4);
          *(char *)((long)pvVar7 + (uVar23 & 0xffff) + 0x30000) = (char)uVar29;
          if (0xfffe < uVar37) {
            uVar37 = 0xffff;
          }
          *(short *)((long)pvVar7 + (ulong)uVar3 * 4 + 0x40000) = (short)uVar37;
          *(undefined2 *)((long)pvVar7 + (ulong)uVar3 * 4 + 0x40002) =
               *(undefined2 *)((long)pvVar7 + uVar36 * 2 + 0x20000);
          *(uint *)((long)pvVar7 + uVar36 * 4) = (uint)uVar23;
          *(ushort *)((long)pvVar7 + uVar36 * 2 + 0x20000) = uVar3;
          uVar43 = uVar43 - 1;
          pvVar7 = (s->hasher_).privat._H40.extra;
          uVar29 = (uint)(*(int *)(data + ((uint)uVar43 & uVar4)) * 0x1e35a7bd) >> 0x11;
          uVar23 = (ulong)uVar29;
          uVar3 = (s->hasher_).privat._H42.free_slot_idx[0];
          (s->hasher_).privat._H42.free_slot_idx[0] = uVar3 + 1;
          uVar36 = uVar43 - *(uint *)((long)pvVar7 + uVar23 * 4);
          *(char *)((long)pvVar7 + (uVar43 & 0xffff) + 0x30000) = (char)uVar29;
          if (0xfffe < uVar36) {
            uVar36 = 0xffff;
          }
          *(short *)((long)pvVar7 + (ulong)uVar3 * 4 + 0x40000) = (short)uVar36;
          *(undefined2 *)((long)pvVar7 + (ulong)uVar3 * 4 + 0x40002) =
               *(undefined2 *)((long)pvVar7 + uVar23 * 2 + 0x20000);
          *(uint *)((long)pvVar7 + uVar23 * 4) = (uint)uVar43;
          *(ushort *)((long)pvVar7 + uVar23 * 2 + 0x20000) = uVar3;
        }
        break;
      case 0x2a:
        if ((2 < uVar18) && (2 < uVar27)) {
          uVar23 = uVar43 - 3;
          pvVar7 = (s->hasher_).privat._H42.extra;
          uVar31 = (uint)(*(int *)(data + ((uint)uVar23 & uVar4)) * 0x1e35a7bd) >> 0x11;
          uVar36 = (ulong)uVar31;
          uVar29 = uVar31 & 0x1ff;
          uVar3 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar29 * 2 + 0x58);
          *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar29 * 2 + 0x58) = uVar3 + 1;
          uVar37 = (ulong)uVar3 & 0x1ff;
          uVar41 = uVar23 - *(uint *)((long)pvVar7 + uVar36 * 4);
          if (0xfffe < uVar41) {
            uVar41 = 0xffff;
          }
          *(char *)((long)pvVar7 + (uVar23 & 0xffff) + 0x30000) = (char)uVar31;
          *(short *)((long)pvVar7 + uVar37 * 4 + (ulong)(uVar29 << 0xb) + 0x40000) = (short)uVar41;
          *(undefined2 *)((long)pvVar7 + uVar37 * 4 + (ulong)(uVar29 << 0xb) + 0x40002) =
               *(undefined2 *)((long)pvVar7 + uVar36 * 2 + 0x20000);
          *(uint *)((long)pvVar7 + uVar36 * 4) = (uint)uVar23;
          *(short *)((long)pvVar7 + uVar36 * 2 + 0x20000) = (short)uVar37;
          uVar23 = uVar43 - 2;
          pvVar7 = (s->hasher_).privat._H42.extra;
          uVar29 = (uint)(*(int *)(data + ((uint)uVar23 & uVar4)) * 0x1e35a7bd) >> 0x11;
          uVar37 = (ulong)uVar29;
          uVar34 = uVar29 & 0x1ff;
          uVar3 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar34 * 2 + 0x58);
          *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar34 * 2 + 0x58) = uVar3 + 1;
          uVar31 = uVar3 & 0x1ff;
          uVar36 = uVar23 - *(uint *)((long)pvVar7 + uVar37 * 4);
          *(char *)((long)pvVar7 + (uVar23 & 0xffff) + 0x30000) = (char)uVar29;
          if (0xfffe < uVar36) {
            uVar36 = 0xffff;
          }
          *(short *)((long)pvVar7 + (ulong)uVar31 * 4 + (ulong)(uVar34 << 0xb) + 0x40000) =
               (short)uVar36;
          *(undefined2 *)((long)pvVar7 + (ulong)uVar31 * 4 + (ulong)(uVar34 << 0xb) + 0x40002) =
               *(undefined2 *)((long)pvVar7 + uVar37 * 2 + 0x20000);
          *(uint *)((long)pvVar7 + uVar37 * 4) = (uint)uVar23;
          *(short *)((long)pvVar7 + uVar37 * 2 + 0x20000) = (short)uVar31;
          uVar43 = uVar43 - 1;
          pvVar7 = (s->hasher_).privat._H42.extra;
          uVar31 = (uint)(*(int *)(data + ((uint)uVar43 & uVar4)) * 0x1e35a7bd) >> 0x11;
          uVar23 = (ulong)uVar31;
          uVar29 = uVar31 & 0x1ff;
          uVar3 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar29 * 2 + 0x58);
          *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar29 * 2 + 0x58) = uVar3 + 1;
          uVar36 = (ulong)uVar3 & 0x1ff;
          uVar37 = uVar43 - *(uint *)((long)pvVar7 + uVar23 * 4);
          *(char *)((long)pvVar7 + (uVar43 & 0xffff) + 0x30000) = (char)uVar31;
          if (0xfffe < uVar37) {
            uVar37 = 0xffff;
          }
          *(short *)((long)pvVar7 + uVar36 * 4 + (ulong)(uVar29 << 0xb) + 0x40000) = (short)uVar37;
          *(undefined2 *)((long)pvVar7 + uVar36 * 4 + (ulong)(uVar29 << 0xb) + 0x40002) =
               *(undefined2 *)((long)pvVar7 + uVar23 * 2 + 0x20000);
          *(uint *)((long)pvVar7 + uVar23 * 4) = (uint)uVar43;
          *(short *)((long)pvVar7 + uVar23 * 2 + 0x20000) = (short)uVar36;
        }
      }
    }
    else {
      if (iVar17 == 0x36) {
        if ((uVar18 < 7) || (uVar27 < 3)) goto switchD_0012fcf5_caseD_24;
        uVar29 = uVar27 - 3;
        puVar20 = (s->hasher_).privat._H2.buckets_;
        uVar31 = 0xfffff;
        puVar20[(uint)((ulong)(*(long *)(data + (uVar29 & uVar4)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                (uVar29 & 0x18) & 0xfffff] = uVar29;
        uVar29 = uVar27 - 2;
        puVar20[(uint)((ulong)(*(long *)(data + (uVar29 & uVar4)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                (uVar29 & 0x18) & 0xfffff] = uVar29;
        uVar29 = (uint)((ulong)(*(long *)(data + (uVar27 - 1 & uVar4)) * 0x35a7bd1e35a7bd00) >> 0x2c
                       );
        goto LAB_00130a85;
      }
      if (iVar17 != 0x37) {
        if (iVar17 == 0x41) {
          if ((6 < uVar18) && (2 < uVar27)) {
            uVar36 = (s->hasher_).privat._H6.hash_mask_;
            uVar37 = (*(ulong *)(data + (uVar27 - 3 & uVar4)) & uVar36) * 0x1fe35a7bd3579bd3 >>
                     (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
            puVar5 = (s->hasher_).privat._H6.num_;
            puVar20 = (s->hasher_).privat._H6.buckets_;
            uVar41 = uVar37 & 0xffffffff;
            uVar3 = puVar5[uVar41];
            uVar29 = (s->hasher_).privat._H6.block_mask_;
            bVar26 = *(byte *)((long)&(s->hasher_).privat + 0x24);
            puVar5[uVar41] = uVar3 + 1;
            puVar20[(ulong)(uVar29 & uVar3) + (ulong)(uint)((int)uVar37 << (bVar26 & 0x1f))] =
                 uVar27 - 3;
            bVar26 = *(byte *)((long)&(s->hasher_).privat + 0x24);
            uVar37 = (*(ulong *)(data + (uVar27 - 2 & uVar4)) & uVar36) * 0x1fe35a7bd3579bd3 >>
                     (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
            uVar41 = uVar37 & 0xffffffff;
            uVar3 = puVar5[uVar41];
            uVar29 = (s->hasher_).privat._H6.block_mask_;
            puVar5[uVar41] = uVar3 + 1;
            puVar20[(ulong)(uVar29 & uVar3) + (ulong)(uint)((int)uVar37 << (bVar26 & 0x1f))] =
                 uVar27 - 2;
            bVar26 = *(byte *)((long)&(s->hasher_).privat + 0x24);
            uVar36 = (uVar36 & *(ulong *)(data + (uVar27 - 1 & uVar4))) * 0x1fe35a7bd3579bd3 >>
                     (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
            uVar37 = uVar36 & 0xffffffff;
            uVar3 = puVar5[uVar37];
            uVar29 = (s->hasher_).privat._H6.block_mask_;
            puVar5[uVar37] = uVar3 + 1;
            puVar20[(ulong)(uVar29 & uVar3) + (ulong)(uint)((int)uVar36 << (bVar26 & 0x1f))] =
                 uVar27 - 1;
            local_220 = uVar40;
          }
          uVar36 = uVar19 - (uVar4 & uVar27);
          if (uVar23 <= uVar36) {
            uVar36 = uVar23;
          }
          if (0x1f < (uint)uVar36) {
            (s->hasher_).privat._H65.hb.state = 0;
            lVar30 = 0;
            uVar33 = 0;
            do {
              uVar33 = uVar33 * (s->hasher_).privat._H65.hb.factor +
                       (uint)data[lVar30 + (ulong)(uVar4 & uVar27)] + 1;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 0x20);
            (s->hasher_).privat._H65.hb.state = uVar33;
          }
          *(int *)((long)&(s->hasher_).privat + 0x58) = (int)uVar43;
          *(int *)((long)&(s->hasher_).privat + 0x5c) = (int)(uVar43 >> 0x20);
        }
        goto switchD_0012fcf5_caseD_24;
      }
      if ((6 < uVar18) && (2 < uVar27)) {
        uVar29 = uVar27 - 3;
        puVar20 = (s->hasher_).privat._H2.buckets_;
        puVar20[(uint)((ulong)(*(long *)(data + (uVar29 & uVar4)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                (uVar29 & 0x18) & 0xfffff] = uVar29;
        uVar29 = uVar27 - 2;
        puVar20[(uint)((ulong)(*(long *)(data + (uVar29 & uVar4)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                (uVar29 & 0x18) & 0xfffff] = uVar29;
        uVar29 = uVar27 - 1;
        puVar20[(uint)((ulong)(*(long *)(data + (uVar29 & uVar4)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                (uVar29 & 0x18) & 0xfffff] = uVar29;
      }
      if (((ulong)puVar46 & 3) != 0) {
        uVar36 = 4 - ((ulong)puVar46 & 3);
        bVar47 = uVar23 < uVar36;
        uVar23 = uVar23 - uVar36;
        if (bVar47) {
          uVar23 = 0;
        }
        uVar43 = uVar43 + uVar36;
      }
      uVar37 = (ulong)((uint)uVar43 & uVar4);
      uVar36 = uVar19 - uVar37;
      if (uVar23 < uVar36) {
        uVar36 = uVar23;
      }
      if (0x1f < uVar36) {
        (s->hasher_).privat._H5.hash_shift_ = 0;
        iVar17 = 0;
        uVar23 = 0xfffffffffffffffc;
        do {
          iVar17 = iVar17 * (s->hasher_).privat._H35.hb.factor + (uint)data[uVar23 + uVar37 + 4] + 1
          ;
          uVar23 = uVar23 + 4;
        } while (uVar23 < 0x1c);
        goto LAB_00130b8f;
      }
LAB_00130b95:
      *(int *)((long)&(s->hasher_).privat + 0x20) = (int)uVar43;
      *(int *)((long)&(s->hasher_).privat + 0x24) = (int)(uVar43 >> 0x20);
    }
    goto switchD_0012fcf5_caseD_24;
  }
  switch(iVar17) {
  case 2:
    if ((6 < uVar18) && (2 < uVar27)) {
      puVar20 = (s->hasher_).privat._H2.buckets_;
      puVar20[(ulong)(*(long *)(data + (uVar27 - 3 & uVar4)) * -0x42e1ca5843000000) >> 0x30] =
           uVar27 - 3;
      puVar20[(ulong)(*(long *)(data + (uVar27 - 2 & uVar4)) * -0x42e1ca5843000000) >> 0x30] =
           uVar27 - 2;
      puVar20[(ulong)(*(long *)(data + (uVar27 - 1 & uVar4)) * -0x42e1ca5843000000) >> 0x30] =
           uVar27 - 1;
    }
    break;
  case 3:
    if ((uVar18 < 7) || (uVar27 < 3)) break;
    uVar29 = uVar27 - 3;
    puVar20 = (s->hasher_).privat._H2.buckets_;
    uVar31 = 0xffff;
    puVar20[(uint)(ushort)((ulong)(*(long *)(data + (uVar29 & uVar4)) * -0x42e1ca5843000000) >> 0x30
                          ) + (uVar29 & 8) & 0xffff] = uVar29;
    uVar29 = uVar27 - 2;
    puVar20[(uint)(ushort)((ulong)(*(long *)(data + (uVar29 & uVar4)) * -0x42e1ca5843000000) >> 0x30
                          ) + (uVar29 & 8) & 0xffff] = uVar29;
    uVar29 = (uint)(ushort)((ulong)(*(long *)(data + (uVar27 - 1 & uVar4)) * -0x42e1ca5843000000) >>
                           0x30);
    uVar34 = uVar27 - 1 & 8;
    goto LAB_00130a8b;
  case 4:
    if ((uVar18 < 7) || (uVar27 < 3)) break;
    uVar29 = uVar27 - 3;
    puVar20 = (s->hasher_).privat._H2.buckets_;
    uVar31 = 0x1ffff;
    puVar20[(uint)((ulong)(*(long *)(data + (uVar29 & uVar4)) * -0x42e1ca5843000000) >> 0x2f) +
            (uVar29 & 0x18) & 0x1ffff] = uVar29;
    uVar29 = uVar27 - 2;
    puVar20[(uint)((ulong)(*(long *)(data + (uVar29 & uVar4)) * -0x42e1ca5843000000) >> 0x2f) +
            (uVar29 & 0x18) & 0x1ffff] = uVar29;
    uVar29 = (uint)((ulong)(*(long *)(data + (uVar27 - 1 & uVar4)) * -0x42e1ca5843000000) >> 0x2f);
LAB_00130a85:
    uVar34 = uVar27 - 1 & 0x18;
LAB_00130a8b:
    puVar20[uVar29 + uVar34 & uVar31] = uVar27 - 1;
    break;
  case 5:
    if ((2 < uVar18) && (2 < uVar27)) {
      uVar29 = (uint)(*(int *)(data + (uVar27 - 3 & uVar4)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      puVar5 = (s->hasher_).privat._H5.num_;
      uVar3 = puVar5[uVar29];
      puVar20 = (s->hasher_).privat._H5.buckets_;
      puVar20[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar3) +
              (ulong)(uVar29 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar27 - 3
      ;
      puVar5[uVar29] = uVar3 + 1;
      uVar29 = (uint)(*(int *)(data + (uVar27 - 2 & uVar4)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      uVar3 = puVar5[uVar29];
      puVar20[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar3) +
              (ulong)(uVar29 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar27 - 2
      ;
      puVar5[uVar29] = uVar3 + 1;
      uVar29 = (uint)(*(int *)(data + (uVar27 - 1 & uVar4)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      uVar3 = puVar5[uVar29];
      puVar20[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar3) +
              (ulong)(uVar29 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar27 - 1
      ;
      puVar5[uVar29] = uVar3 + 1;
    }
    break;
  case 6:
    if ((6 < uVar18) && (2 < uVar27)) {
      uVar23 = (s->hasher_).privat._H6.hash_mask_;
      uVar43 = (*(ulong *)(data + (uVar27 - 3 & uVar4)) & uVar23) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
      puVar5 = (s->hasher_).privat._H6.num_;
      puVar20 = (s->hasher_).privat._H6.buckets_;
      uVar36 = uVar43 & 0xffffffff;
      uVar3 = puVar5[uVar36];
      uVar29 = (s->hasher_).privat._H6.block_mask_;
      bVar26 = *(byte *)((long)&(s->hasher_).privat + 0x24);
      puVar5[uVar36] = uVar3 + 1;
      puVar20[(ulong)(uVar29 & uVar3) + (ulong)(uint)((int)uVar43 << (bVar26 & 0x1f))] = uVar27 - 3;
      bVar26 = *(byte *)((long)&(s->hasher_).privat + 0x24);
      uVar43 = (*(ulong *)(data + (uVar27 - 2 & uVar4)) & uVar23) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
      uVar36 = uVar43 & 0xffffffff;
      uVar3 = puVar5[uVar36];
      uVar29 = (s->hasher_).privat._H6.block_mask_;
      puVar5[uVar36] = uVar3 + 1;
      puVar20[(ulong)(uVar29 & uVar3) + (ulong)(uint)((int)uVar43 << (bVar26 & 0x1f))] = uVar27 - 2;
      bVar26 = *(byte *)((long)&(s->hasher_).privat + 0x24);
      uVar23 = (uVar23 & *(ulong *)(data + (uVar27 - 1 & uVar4))) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
      uVar43 = uVar23 & 0xffffffff;
      uVar3 = puVar5[uVar43];
      uVar29 = (s->hasher_).privat._H6.block_mask_;
      puVar5[uVar43] = uVar3 + 1;
      puVar20[(ulong)(uVar29 & uVar3) + (ulong)(uint)((int)uVar23 << (bVar26 & 0x1f))] = uVar27 - 1;
    }
    break;
  case 10:
    if ((2 < uVar18) && (0x7f < uVar27)) {
      local_1d0 = (uVar43 + uVar23) - 0x7f;
      if (uVar43 < local_1d0) {
        local_1d0 = uVar43;
      }
      if (uVar43 - 0x7f < local_1d0) {
        local_208 = (Command *)(s->hasher_).privat._H5.bucket_size_;
        local_1d8 = (size_t *)(s->hasher_).privat._H2.buckets_;
        pHVar6 = (s->hasher_).privat._H40.common;
        uVar23 = uVar43 - 0x7f;
LAB_00130393:
        local_1e0 = (BlockSplitFromDecoder *)uVar23;
        uVar23 = uVar43 - (long)local_1e0;
        if (uVar23 < 0x10) {
          uVar23 = 0xf;
        }
        uVar29 = (uint)local_1e0 & uVar4;
        local_1f0 = (int *)(data + uVar29);
        uVar41 = (ulong)((uint)(*(int *)(data + uVar29) * 0x1e35a7bd) >> 0xf);
        uVar42 = (ulong)*(uint *)((long)local_1d8 + uVar41 * 4);
        uVar36 = ((ulong)local_208 & (ulong)local_1e0) * 2 + 1;
        uVar37 = ((ulong)local_208 & (ulong)local_1e0) * 2;
        *(uint *)((long)local_1d8 + uVar41 * 4) = (uint)local_1e0;
        lVar30 = 0x40;
        local_200 = 0;
        local_210 = 0;
LAB_00130414:
        if ((local_1e0 != (BlockSplitFromDecoder *)uVar42) &&
           (lVar30 != 0 && (long)local_1e0 - uVar42 <= (long)local_208 - uVar23)) {
          uVar29 = (uint)uVar42;
          uVar41 = local_210;
          if (local_200 < local_210) {
            uVar41 = local_200;
          }
          puVar21 = data + uVar41 + (uVar29 & uVar4);
          uVar45 = 0x80 - uVar41;
          if (7 < uVar45) {
            uVar28 = uVar45 & 0xfffffffffffffff8;
            lVar38 = 0;
            uVar32 = 0;
LAB_001304aa:
            if (*(ulong *)(puVar21 + uVar32 * 8) ==
                *(ulong *)((long)local_1f0 + uVar32 * 8 + uVar41)) goto code_r0x001304ba;
            uVar28 = *(ulong *)((long)local_1f0 + uVar32 * 8 + uVar41) ^
                     *(ulong *)(puVar21 + uVar32 * 8);
            uVar45 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
              }
            }
            uVar32 = (uVar45 >> 3 & 0x1fffffff) - lVar38;
            goto LAB_0013050c;
          }
          uVar28 = 0;
          goto LAB_00130592;
        }
        *(int *)((long)&pHVar6->extra + uVar37 * 4) = (s->hasher_).privat._H5.hash_shift_;
        *(int *)((long)&pHVar6->extra + uVar36 * 4) = (s->hasher_).privat._H5.hash_shift_;
        bVar47 = false;
        goto LAB_00130583;
      }
    }
  }
switchD_0012fcf5_caseD_24:
  uVar23 = s->last_flush_pos_;
  uVar29 = (uint)uVar23;
  if (0xbfffffff < uVar23) {
    uVar29 = ((int)(uVar29 * 2) >> 1 & 0xc0000000U) + (uVar29 & 0x3fffffff) + 0x80000000;
  }
  num_commands = &s->num_commands_;
  if (((s->params).quality < 10) ||
     (iVar17 = BrotliIsMostlyUTF8(data,(ulong)uVar29,uVar19,s->input_pos_ - uVar23,0.75),
     iVar17 != 0)) {
    uVar23 = 2;
  }
  else {
    uVar23 = 3;
  }
  sVar44 = *num_commands;
  if ((sVar44 == 0) || (s->last_insert_len_ != 0)) {
    sVar35 = (ulong)puVar46 & 0xffffffff;
  }
  else {
    pCVar24 = s->commands_;
    uVar36 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
    uVar43 = s->last_processed_pos_ - (ulong)(pCVar24[sVar44 - 1].copy_len_ & 0x1ffffff);
    if (uVar36 <= uVar43) {
      uVar43 = uVar36;
    }
    iVar17 = s->dist_cache_[0];
    uVar3 = pCVar24[sVar44 - 1].dist_prefix_;
    uVar31 = uVar3 & 0x3ff;
    uVar33 = (s->params).dist.num_direct_distance_codes;
    uVar29 = uVar33 + 0x10;
    if (uVar29 <= uVar31) {
      uVar34 = (s->params).dist.distance_postfix_bits;
      bVar26 = (byte)uVar34;
      uVar31 = (uVar31 - uVar33) - 0x10;
      uVar31 = (~(-1 << (bVar26 & 0x1f)) & uVar31) + uVar29 +
               (pCVar24[sVar44 - 1].dist_extra_ +
                (((uVar31 >> (uVar34 & 0x1f) & 1) != 0) + 2 << ((byte)(uVar3 >> 10) & 0x1f)) + -4 <<
               (bVar26 & 0x1f));
      local_220 = uVar40;
    }
    if ((ulong)(uVar31 - 0xf) == (long)iVar17 || uVar31 < 0x10) {
      if (uVar18 == 0 || uVar43 < (ulong)(long)iVar17) {
        sVar35 = (ulong)puVar46 & 0xffffffff;
      }
      else {
        uVar29 = (s->ringbuffer_).mask_;
        puVar21 = (s->ringbuffer_).buffer_;
        sVar35 = (size_t)(((int)local_1f8 + uVar27) - (int)local_1e8);
        do {
          uVar27 = (uint)puVar46;
          if (puVar21[uVar27 & uVar29] != puVar21[uVar27 - iVar17 & uVar29]) {
            sVar35 = (ulong)puVar46 & 0xffffffff;
            goto LAB_00131493;
          }
          pCVar24[sVar44 - 1].copy_len_ = pCVar24[sVar44 - 1].copy_len_ + 1;
          puVar46 = (ContextLut)(ulong)(uVar27 + 1);
          uVar27 = (int)uVar40 - 1;
          uVar40 = (ulong)uVar27;
        } while (uVar27 != 0);
        uVar40 = 0;
      }
LAB_00131493:
      uVar29 = pCVar24[sVar44 - 1].insert_len_;
      uVar18 = (pCVar24[sVar44 - 1].copy_len_ >> 0x19) + (pCVar24[sVar44 - 1].copy_len_ & 0x1ffffff)
      ;
      uVar27 = uVar29;
      if (5 < (ulong)uVar29) {
        if (uVar29 < 0x82) {
          uVar43 = (ulong)uVar29 - 2;
          uVar29 = 0x1f;
          uVar27 = (uint)uVar43;
          if (uVar27 != 0) {
            for (; uVar27 >> uVar29 == 0; uVar29 = uVar29 - 1) {
            }
          }
          uVar27 = (int)(uVar43 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar29 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar29 < 0x842) {
          uVar27 = 0x1f;
          if (uVar29 - 0x42 != 0) {
            for (; uVar29 - 0x42 >> uVar27 == 0; uVar27 = uVar27 - 1) {
            }
          }
          uVar27 = (uVar27 ^ 0xffe0) + 0x2a;
        }
        else {
          uVar27 = 0x15;
          if (0x1841 < uVar29) {
            uVar27 = (uint)(ushort)(0x17 - (uVar29 < 0x5842));
          }
        }
      }
      if (uVar18 < 10) {
        uVar29 = uVar18 - 2;
      }
      else if (uVar18 < 0x86) {
        uVar29 = 0x1f;
        uVar31 = (uint)((ulong)uVar18 - 6);
        if (uVar31 != 0) {
          for (; uVar31 >> uVar29 == 0; uVar29 = uVar29 - 1) {
          }
        }
        uVar29 = (int)((ulong)uVar18 - 6 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar29 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar29 = 0x17;
        if (uVar18 < 0x846) {
          uVar29 = 0x1f;
          if (uVar18 - 0x46 != 0) {
            for (; uVar18 - 0x46 >> uVar29 == 0; uVar29 = uVar29 - 1) {
            }
          }
          uVar29 = (uVar29 ^ 0xffe0) + 0x2c;
        }
      }
      uVar12 = (ushort)uVar29;
      uVar14 = (uVar12 & 7) + ((ushort)uVar27 & 7) * 8;
      if ((((uVar3 & 0x3ff) == 0) && ((ushort)uVar27 < 8)) && (uVar12 < 0x10)) {
        if (7 < uVar12) {
          uVar14 = uVar14 + 0x40;
        }
      }
      else {
        iVar17 = ((uVar27 & 0xffff) >> 3) * 3 + ((uVar29 & 0xffff) >> 3);
        uVar14 = uVar14 + ((ushort)(0x520d40 >> ((char)iVar17 * '\x02' & 0x1fU)) & 0xc0) +
                          (short)iVar17 * 0x40 + 0x40;
      }
      pCVar24[sVar44 - 1].cmd_prefix_ = uVar14;
      local_200 = uVar23;
    }
    else {
      sVar35 = (ulong)puVar46 & 0xffffffff;
      local_200 = uVar23;
    }
  }
  puVar46 = "" + (uint)((int)uVar23 << 9);
  iVar17 = (s->params).quality;
  uVar40 = uVar40 & 0xffffffff;
  piVar22 = s->dist_cache_;
  last_insert_len = &s->last_insert_len_;
  pCVar24 = s->commands_ + sVar44;
  num_literals = &s->num_literals_;
  if (iVar17 == 0xb) {
    BrotliCreateHqZopfliBackwardReferences
              (m,uVar40,sVar35,data,uVar19,puVar46,&s->params,hasher,piVar22,last_insert_len,pCVar24
               ,num_commands,num_literals);
  }
  else if (iVar17 == 10) {
    BrotliCreateZopfliBackwardReferences
              (m,uVar40,sVar35,data,uVar19,puVar46,&s->params,hasher,piVar22,last_insert_len,pCVar24
               ,num_commands,num_literals);
  }
  else {
    BrotliCreateBackwardReferences
              (uVar40,sVar35,data,uVar19,puVar46,&s->params,hasher,piVar22,last_insert_len,pCVar24,
               num_commands,num_literals,s->backward_references_,&s->back_refs_position_,
               s->back_refs_size_);
  }
  iVar17 = (s->params).lgwin;
  iVar15 = (s->params).lgblock;
  if (iVar17 <= iVar15) {
    iVar17 = iVar15;
  }
  cVar25 = '\x17';
  if (iVar17 < 0x17) {
    cVar25 = (char)iVar17;
  }
  uVar40 = 1L << (cVar25 + 1U & 0x3f);
  uVar8 = s->input_pos_;
  uVar9 = s->last_flush_pos_;
  if ((s->params).quality < 4) {
    bVar47 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar47 = false;
  }
  uVar43 = uVar8 - uVar9;
  if (((force_flush != 0 || is_last != 0) || (bVar47)) ||
     ((uVar40 < (1L << ((byte)iVar15 & 0x3f)) + uVar43 ||
      ((uVar40 = uVar40 >> 3, uVar40 <= s->num_literals_ || (uVar40 <= *num_commands)))))) {
    uVar40 = s->last_insert_len_;
    if (uVar40 != 0) {
      pCVar24 = s->commands_;
      sVar44 = s->num_commands_;
      s->num_commands_ = sVar44 + 1;
      pCVar24[sVar44].insert_len_ = (uint32_t)uVar40;
      pCVar24[sVar44].copy_len_ = 0x8000000;
      pCVar24[sVar44].dist_extra_ = 0;
      pCVar24[sVar44].dist_prefix_ = 0x10;
      if (uVar40 < 6) {
        uVar36 = uVar40 & 0xffffffff;
      }
      else if (uVar40 < 0x82) {
        uVar29 = 0x1f;
        uVar27 = (uint)(uVar40 - 2);
        if (uVar27 != 0) {
          for (; uVar27 >> uVar29 == 0; uVar29 = uVar29 - 1) {
          }
        }
        uVar36 = (ulong)((int)(uVar40 - 2 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar29 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar40 < 0x842) {
        uVar27 = (uint32_t)uVar40 - 0x42;
        uVar29 = 0x1f;
        if (uVar27 != 0) {
          for (; uVar27 >> uVar29 == 0; uVar29 = uVar29 - 1) {
          }
        }
        uVar36 = (ulong)((uVar29 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar36 = 0x15;
        if (0x1841 < uVar40) {
          uVar36 = (ulong)(ushort)(0x17 - (uVar40 < 0x5842));
        }
      }
      iVar17 = (int)((uVar36 & 0xffff) >> 3) * 3;
      pCVar24[sVar44].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar17 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar17 * 0x40 +
           ((ushort)uVar36 & 7) * 8 + 0x42;
      s->num_literals_ = s->num_literals_ + uVar40;
      s->last_insert_len_ = 0;
    }
    if (uVar8 != uVar9 || is_last != 0) {
      local_218 = puVar46;
      puVar21 = GetBrotliStorage(s,(ulong)((int)uVar43 * 2 + 0x1f7));
      storage_ix_1 = (size_t)s->last_bytes_bits_;
      *puVar21 = (uint8_t)s->last_bytes_;
      puVar21[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      uVar40 = s->last_flush_pos_;
      uVar43 = uVar43 & 0xffffffff;
      uVar29 = (uint)uVar40;
      if (0xbfffffff < uVar40) {
        uVar29 = (uVar29 & 0x3fffffff) + ((int)(uVar29 * 2) >> 1 & 0xc0000000U) + 0x80000000;
      }
      local_210 = CONCAT44(local_210._4_4_,uVar29);
      prev_byte = s->prev_byte_;
      local_1f8 = CONCAT71(local_1f8._1_7_,s->prev_byte2_);
      sVar44 = s->num_literals_;
      pCVar24 = s->commands_;
      sVar35 = s->num_commands_;
      local_1f0 = s->saved_dist_cache_;
      local_1e0 = s->literals_block_splits_decoder_;
      local_1e8 = s->cmds_block_splits_decoder_;
      memcpy(&table_size,s,0x90);
      if (uVar43 == 0) {
        *(ulong *)(puVar21 + (storage_ix_1 >> 3)) =
             3L << ((byte)storage_ix_1 & 7) | (ulong)puVar21[storage_ix_1 >> 3];
        storage_ix_1 = (size_t)((int)storage_ix_1 + 9U & 0xfffffff8);
      }
      else {
        local_208 = pCVar24;
        local_200 = uVar23;
        iVar17 = ShouldCompress(data,uVar19,uVar40,uVar43,sVar44,sVar35);
        pCVar24 = local_208;
        if (iVar17 == 0) {
          uVar11 = *(undefined8 *)(local_1f0 + 2);
          *(undefined8 *)piVar22 = *(undefined8 *)local_1f0;
          *(undefined8 *)(s->dist_cache_ + 2) = uVar11;
          BrotliStoreUncompressedMetaBlock
                    (is_last,data,local_210 & 0xffffffff,uVar19,uVar43,&storage_ix_1,puVar21);
        }
        else {
          local_220 = CONCAT71(local_220._1_7_,*puVar21);
          uVar2 = puVar21[1];
          uVar40 = storage_ix_1 & 0xff;
          iVar17 = (s->params).quality;
          if (iVar17 < 3) {
            BrotliStoreMetaBlockFast
                      (m,data,local_210 & 0xffffffff,uVar43,uVar19,is_last,&s->params,local_208,
                       sVar35,&storage_ix_1,puVar21);
          }
          else if (iVar17 == 3) {
            BrotliStoreMetaBlockTrivial
                      (m,data,local_210 & 0xffffffff,uVar43,uVar19,is_last,&s->params,local_208,
                       sVar35,&storage_ix_1,puVar21);
          }
          else {
            local_1d8 = &s->current_block_literals_;
            local_1c0 = &s->current_block_cmds_;
            BrotliInitBlockSplit((BlockSplit *)&storage_ix);
            BrotliInitBlockSplit(&local_170);
            BrotliInitBlockSplit(&local_140);
            local_d0 = (HistogramDistance *)0x0;
            sStack_c8 = 0;
            local_e0 = (HistogramCommand *)0x0;
            sStack_d8 = 0;
            local_f0 = (HistogramLiteral *)0x0;
            sStack_e8 = 0;
            local_100 = (uint32_t *)0x0;
            sStack_f8 = 0;
            local_110 = (uint32_t *)0x0;
            sStack_108 = 0;
            iVar17 = (s->params).quality;
            uVar23 = local_210 & 0xffffffff;
            prev_byte2 = (uint8_t)local_1f8;
            local_1f8 = local_1f8 & 0xff;
            local_1d0 = uVar40;
            if (iVar17 < 10) {
              num_literal_contexts = 1;
              local_1b8 = (uint32_t *)0x0;
              if ((s->params).disable_literal_context_modeling == 0) {
                DecideOverLiteralContextModeling
                          (data,uVar23,uVar43,uVar19,iVar17,(s->params).size_hint,
                           &num_literal_contexts,&local_1b8);
              }
              BrotliBuildMetaBlockGreedy
                        (m,data,uVar23,uVar19,prev_byte,prev_byte2,local_218,num_literal_contexts,
                         local_1b8,local_208,sVar35,local_1e0,local_1d8,local_1e8,local_1c0,
                         (MetaBlockSplit *)&storage_ix);
            }
            else {
              BrotliBuildMetaBlock
                        (m,data,uVar23,uVar19,(BrotliEncoderParams *)&table_size,prev_byte,
                         prev_byte2,pCVar24,sVar35,(ContextType)local_200,local_1e0,local_1d8,
                         local_1e8,local_1c0,(MetaBlockSplit *)&storage_ix);
            }
            if (3 < (s->params).quality) {
              BrotliOptimizeHistograms(local_74,(MetaBlockSplit *)&storage_ix);
            }
            local_1a8 = uVar43;
            BrotliStoreMetaBlock
                      (m,data,uVar23,uVar43,uVar19,prev_byte,(uint8_t)local_1f8,is_last,
                       (BrotliEncoderParams *)&table_size,(ContextType)local_200,local_208,sVar35,
                       (MetaBlockSplit *)&storage_ix,&storage_ix_1,puVar21);
            BrotliDestroyBlockSplit(m,(BlockSplit *)&storage_ix);
            BrotliDestroyBlockSplit(m,&local_170);
            BrotliDestroyBlockSplit(m,&local_140);
            BrotliFree(m,local_110);
            local_110 = (uint32_t *)0x0;
            BrotliFree(m,local_100);
            local_100 = (uint32_t *)0x0;
            BrotliFree(m,local_f0);
            local_f0 = (HistogramLiteral *)0x0;
            BrotliFree(m,local_e0);
            uVar43 = local_1a8;
            local_e0 = (HistogramCommand *)0x0;
            BrotliFree(m,local_d0);
            uVar40 = local_1d0;
          }
          if (uVar43 + 4 < storage_ix_1 >> 3) {
            uVar11 = *(undefined8 *)(local_1f0 + 2);
            *(undefined8 *)piVar22 = *(undefined8 *)local_1f0;
            *(undefined8 *)(s->dist_cache_ + 2) = uVar11;
            *puVar21 = (uint8_t)local_220;
            puVar21[1] = uVar2;
            storage_ix_1 = uVar40;
            BrotliStoreUncompressedMetaBlock
                      (is_last,data,local_210 & 0xffffffff,uVar19,uVar43,&storage_ix_1,puVar21);
          }
        }
      }
      uVar40 = storage_ix_1 >> 3;
      s->last_bytes_ = (ushort)puVar21[uVar40];
      s->last_bytes_bits_ = (byte)storage_ix_1 & 7;
      s->last_flush_pos_ = s->input_pos_;
      iVar17 = UpdateLastProcessedPos(s);
      if (iVar17 != 0) {
        (s->hasher_).common.is_prepared_ = 0;
      }
      uVar19 = s->last_flush_pos_;
      if (uVar19 != 0) {
        s->prev_byte_ = data[uVar4 & (int)uVar19 - 1U];
      }
      if (1 < uVar19) {
        s->prev_byte2_ = data[uVar4 & (int)uVar19 - 2U];
      }
      s->num_commands_ = 0;
      s->num_literals_ = 0;
      uVar11 = *(undefined8 *)(s->dist_cache_ + 2);
      *(undefined8 *)local_1f0 = *(undefined8 *)piVar22;
      *(undefined8 *)(local_1f0 + 2) = uVar11;
      *local_1c8 = puVar21;
      *out_size = uVar40;
      return 1;
    }
  }
  else {
    iVar17 = UpdateLastProcessedPos(s);
    if (iVar17 != 0) {
      (s->hasher_).common.is_prepared_ = 0;
    }
  }
  *out_size = 0;
  return 1;
code_r0x001304ba:
  uVar32 = uVar32 + 1;
  lVar38 = lVar38 + -8;
  if (uVar45 >> 3 == uVar32) goto code_r0x001304c9;
  goto LAB_001304aa;
code_r0x001304c9:
  puVar21 = puVar21 + -lVar38;
LAB_00130592:
  uVar45 = uVar45 & 7;
  uVar32 = uVar28;
  if (uVar45 != 0) {
    uVar39 = uVar28 | uVar45;
    do {
      uVar32 = uVar28;
      if (*(uint8_t *)((long)local_1f0 + uVar28 + uVar41) != *puVar21) break;
      puVar21 = puVar21 + 1;
      uVar28 = uVar28 + 1;
      uVar45 = uVar45 - 1;
      uVar32 = uVar39;
    } while (uVar45 != 0);
  }
LAB_0013050c:
  uVar32 = uVar32 + uVar41;
  if (uVar32 < 0x80) {
    uVar41 = (uVar42 & (ulong)local_208) * 2;
    if (data[uVar32 + (uVar29 & uVar4)] < *(byte *)((long)local_1f0 + uVar32)) {
      *(uint *)((long)&pHVar6->extra + uVar37 * 4) = uVar29;
      uVar41 = uVar41 | 1;
      uVar37 = uVar41;
      local_200 = uVar32;
    }
    else {
      *(uint *)((long)&pHVar6->extra + uVar36 * 4) = uVar29;
      uVar36 = uVar41;
      local_210 = uVar32;
    }
    uVar42 = (ulong)*(uint *)((long)&pHVar6->extra + uVar41 * 4);
    bVar47 = true;
  }
  else {
    *(undefined4 *)((long)&pHVar6->extra + uVar37 * 4) =
         *(undefined4 *)(&pHVar6->extra + (uVar42 & (ulong)local_208));
    *(undefined4 *)((long)&pHVar6->extra + uVar36 * 4) =
         *(undefined4 *)((long)&pHVar6->extra + (uVar42 & (ulong)local_208) * 8 + 4);
    bVar47 = false;
  }
LAB_00130583:
  lVar30 = lVar30 + -1;
  if (!bVar47) goto LAB_001305c9;
  goto LAB_00130414;
LAB_001305c9:
  uVar23 = (long)local_1e0 + 1U;
  local_220 = uVar40;
  local_218 = puVar46;
  if ((long)local_1e0 + 1U == local_1d0) goto switchD_0012fcf5_caseD_24;
  goto LAB_00130393;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;
  ContextLut literal_context_lut;

  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->command_buf_) ||
        BROTLI_IS_NULL(s->literal_buf_)) {
      return BROTLI_FALSE;
    }
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(new_commands)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));
  literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }
  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_, s->backward_references_,
        &s->back_refs_position_, s->back_refs_size_);
  }
  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(&s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage, s->literals_block_splits_decoder_,
        &s->current_block_literals_, s->cmds_block_splits_decoder_,
        &s->current_block_cmds_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(&s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}